

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QCss::StyleRule>::moveAppend
          (QGenericArrayOps<QCss::StyleRule> *this,StyleRule *b,StyleRule *e)

{
  StyleRule *pSVar1;
  Data *pDVar2;
  Selector *pSVar3;
  qsizetype qVar4;
  Data *pDVar5;
  Declaration *pDVar6;
  qsizetype qVar7;
  
  if ((b != e) && (b < e)) {
    pSVar1 = (this->super_QArrayDataPointer<QCss::StyleRule>).ptr;
    qVar7 = (this->super_QArrayDataPointer<QCss::StyleRule>).size;
    do {
      pDVar2 = (b->selectors).d.d;
      (b->selectors).d.d = (Data *)0x0;
      pSVar1[qVar7].selectors.d.d = pDVar2;
      pSVar3 = (b->selectors).d.ptr;
      (b->selectors).d.ptr = (Selector *)0x0;
      pSVar1[qVar7].selectors.d.ptr = pSVar3;
      qVar4 = (b->selectors).d.size;
      (b->selectors).d.size = 0;
      pSVar1[qVar7].selectors.d.size = qVar4;
      pDVar5 = (b->declarations).d.d;
      (b->declarations).d.d = (Data *)0x0;
      pSVar1[qVar7].declarations.d.d = pDVar5;
      pDVar6 = (b->declarations).d.ptr;
      (b->declarations).d.ptr = (Declaration *)0x0;
      pSVar1[qVar7].declarations.d.ptr = pDVar6;
      qVar4 = (b->declarations).d.size;
      (b->declarations).d.size = 0;
      pSVar1[qVar7].declarations.d.size = qVar4;
      pSVar1[qVar7].order = b->order;
      b = b + 1;
      qVar7 = (this->super_QArrayDataPointer<QCss::StyleRule>).size + 1;
      (this->super_QArrayDataPointer<QCss::StyleRule>).size = qVar7;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }